

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-blows.c
# Opt level: O1

_Bool monster_damage_target(melee_effect_handler_context_t *context,_Bool no_further_monster_effect)

{
  _Bool _Var1;
  undefined1 uVar2;
  wchar_t damage;
  
  if (context->p == (player *)0x0) {
    display_blow_message_vs_monster(context->method,context->m_name,context->t_mon->midx);
    _Var1 = mon_take_nonplayer_hit(context->damage,context->t_mon,MON_MSG_NONE,MON_MSG_DIE);
    uVar2 = _Var1 || no_further_monster_effect;
  }
  else {
    damage = player_apply_damage_reduction(context->p,context->damage);
    display_blow_message_vs_player(context->method,context->m_name,context->p,damage);
    take_hit(context->p,damage,context->ddesc);
    uVar2 = context->p->is_dead;
  }
  return (_Bool)uVar2;
}

Assistant:

static bool monster_damage_target(melee_effect_handler_context_t *context,
								  bool no_further_monster_effect)
{
	/* Take damage */
	if (context->p) {
		/*
		 * Player damage reduction does not affect the damage used for
		 * side effect calculations so leave context->damage as is.
		 */
		int reduced = player_apply_damage_reduction(context->p,
			context->damage);

		display_blow_message_vs_player(context->method, context->m_name,
			context->p, reduced);
		take_hit(context->p, reduced, context->ddesc);
		if (context->p->is_dead) return true;
	} else {
		bool dead;

		display_blow_message_vs_monster(context->method,
			context->m_name, context->t_mon->midx);
		dead = mon_take_nonplayer_hit(context->damage, context->t_mon,
			MON_MSG_NONE, MON_MSG_DIE);
		return (dead || no_further_monster_effect);
	}
	return false;
}